

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::UnitTestOptions::MatchesFilter(string *name_str,char *filter)

{
  byte bVar1;
  string *in_stack_00000088;
  UnitTestFilter *in_stack_00000090;
  undefined7 in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff68;
  UnitTestFilter *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (allocator<char> *)in_stack_ffffffffffffff70);
  anon_unknown_37::UnitTestFilter::UnitTestFilter(in_stack_00000090,in_stack_00000088);
  bVar1 = anon_unknown_37::UnitTestFilter::MatchesName
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  anon_unknown_37::UnitTestFilter::~UnitTestFilter
            ((UnitTestFilter *)CONCAT17(bVar1,in_stack_ffffffffffffff50));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  return (bool)(bVar1 & 1);
}

Assistant:

bool UnitTestOptions::MatchesFilter(const std::string& name_str,
                                    const char* filter) {
  return UnitTestFilter(filter).MatchesName(name_str);
}